

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          CappedArray<char,_8UL> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3,ArrayPtr<const_char> *params_4,String *params_5,
          ArrayPtr<const_char> *params_6,String *params_7,ArrayPtr<const_char> *params_8)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *pcVar4;
  Branch *pBVar5;
  size_t sVar6;
  long lVar7;
  size_t result_2;
  char *pos;
  char *local_a8 [3];
  size_t sStack_90;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  String local_60;
  ArrayPtr<const_char> *local_48;
  StringTree *local_40;
  CappedArray<char,_8UL> *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_a8[0] = (this->text).content.ptr;
  local_a8[1] = params->ptr;
  local_a8[2] = *(char **)params_1->content;
  sStack_90 = params_2->size_;
  local_88 = params_3->size_;
  sVar6 = 0;
  local_80 = params_4->size_ - 1;
  if (params_4->size_ == 0) {
    local_80 = sVar6;
  }
  local_78 = (params_5->content).size_;
  local_70 = params_6->size_ - 1;
  if (params_6->size_ == 0) {
    local_70 = sVar6;
  }
  local_68 = (params_7->content).size_;
  lVar7 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)local_a8 + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x48);
  __return_storage_ptr__->size_ = sVar6;
  sVar6 = 0;
  local_80 = 0;
  local_70 = 0;
  lVar7 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)local_a8 + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x48);
  local_40 = this;
  local_38 = params_1;
  heapString(&local_60,sVar6);
  (__return_storage_ptr__->text).content.ptr = local_60.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_60.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_60.content.disposer;
  sVar6 = 0;
  local_88 = 0;
  local_a8[2] = (char *)0x0;
  sStack_90 = 0;
  local_a8[0] = (char *)0x0;
  local_a8[1] = (char *)0x0;
  local_80 = 1;
  local_78 = 0;
  local_70 = 1;
  local_68 = 0;
  lVar7 = 0;
  do {
    sVar6 = sVar6 + *(long *)((long)local_a8 + lVar7);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x48);
  local_48 = params_2;
  pBVar5 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar6,sVar6,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_60.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_60.content.ptr = (char *)pBVar5;
  local_60.content.size_ = sVar6;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar5;
  (__return_storage_ptr__->branches).size_ = sVar6;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  pcVar4 = (local_40->text).content.ptr;
  if (pcVar4 != (char *)0x0) {
    memcpy(pos,(void *)local_40->size_,(size_t)pcVar4);
    pos = pos + (long)pcVar4;
  }
  pcVar4 = params->ptr;
  if (pcVar4 != (char *)0x0) {
    memcpy(pos,&params->size_,(size_t)pcVar4);
    pos = pos + (long)pcVar4;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,(ArrayPtr<const_char> *)local_38,local_48,params_3,
             (String *)params_4,(ArrayPtr<const_char> *)params_5,(String *)params_6,
             (ArrayPtr<const_char> *)params_7);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}